

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_sentence(LatticeImpl *this,char *sentence,size_t len)

{
  size_type __new_size;
  int iVar1;
  undefined4 extraout_var;
  char *__dest;
  
  (**(this->super_Lattice)._vptr_Lattice)();
  __new_size = len + 4;
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::resize(&this->end_nodes_,__new_size)
  ;
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::resize
            (&this->begin_nodes_,__new_size);
  iVar1 = (*(this->super_Lattice)._vptr_Lattice[0x12])(this,0x40);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this->super_Lattice)._vptr_Lattice[0x12])(this);
    __dest = sentence;
    if ((char)iVar1 == '\0') goto LAB_00121582;
  }
  iVar1 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
  __dest = Allocator<mecab_node_t,_mecab_path_t>::alloc
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar1),len + 1)
  ;
  strncpy(__dest,sentence,len + 1);
LAB_00121582:
  this->sentence_ = __dest;
  this->size_ = len;
  memset((this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
         _M_impl.super__Vector_impl_data._M_start,0,__new_size * 8);
  memset((this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
         _M_impl.super__Vector_impl_data._M_start,0,__new_size * 8);
  return;
}

Assistant:

void LatticeImpl::set_sentence(const char *sentence, size_t len) {
  clear();
  end_nodes_.resize(len + 4);
  begin_nodes_.resize(len + 4);

  if (has_request_type(MECAB_ALLOCATE_SENTENCE) ||
      has_request_type(MECAB_PARTIAL)) {
    char *new_sentence = allocator()->strdup(sentence, len);
    sentence_ = new_sentence;
  } else {
    sentence_ = sentence;
  }

  size_ = len;
  std::memset(&end_nodes_[0],   0,
              sizeof(end_nodes_[0]) * (len + 4));
  std::memset(&begin_nodes_[0], 0,
              sizeof(begin_nodes_[0]) * (len + 4));
}